

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scapp.h
# Opt level: O3

ktx_pack_astc_quality_levels_e astcQualityLevel(char *quality)

{
  ktx_pack_astc_quality_levels_e kVar1;
  int iVar2;
  iterator iVar3;
  long lVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  undefined1 local_f7;
  undefined1 local_f6;
  undefined1 local_f5;
  ktx_pack_astc_quality_levels_e local_f4 [5];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
  local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
  local_b8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
  local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
  local_68;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
  local_40;
  
  if (astcQualityLevel(char_const*)::astc_quality_mapping_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&astcQualityLevel(char_const*)::astc_quality_mapping_abi_cxx11_);
    if (iVar2 != 0) {
      local_f4[0] = KTX_PACK_ASTC_QUALITY_LEVEL_FASTEST;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
      ::pair<const_char_(&)[8],_ktx_pack_astc_quality_levels_e,_true>
                (&local_e0,(char (*) [8])"fastest",local_f4);
      local_f4[4] = 10;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
      ::pair<const_char_(&)[5],_ktx_pack_astc_quality_levels_e,_true>
                (&local_b8,(char (*) [5])"fast",local_f4 + 4);
      local_f4[3] = 0x3c;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
      ::pair<const_char_(&)[7],_ktx_pack_astc_quality_levels_e,_true>
                (&local_90,(char (*) [7])"medium",local_f4 + 3);
      local_f4[2] = 0x62;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
      ::pair<const_char_(&)[9],_ktx_pack_astc_quality_levels_e,_true>
                (&local_68,(char (*) [9])"thorough",local_f4 + 2);
      local_f4[1] = 100;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>
      ::pair<const_char_(&)[11],_ktx_pack_astc_quality_levels_e,_true>
                (&local_40,(char (*) [11])"exhaustive",local_f4 + 1);
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ktx_pack_astc_quality_levels_e>,std::allocator<std::pair<std::__cxx11::string_const,ktx_pack_astc_quality_levels_e>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_Hashtable<std::pair<std::__cxx11::string_const,ktx_pack_astc_quality_levels_e>const*>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,ktx_pack_astc_quality_levels_e>,std::allocator<std::pair<std::__cxx11::string_const,ktx_pack_astc_quality_levels_e>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&astcQualityLevel(char_const*)::astc_quality_mapping_abi_cxx11_,&local_e0,
                 &stack0xffffffffffffffe8,0,&local_f5,&local_f6,&local_f7);
      lVar4 = -200;
      paVar5 = &local_40.first.field_2;
      do {
        if (paVar5 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar5->_M_allocated_capacity)[-2]) {
          operator_delete((long *)(&paVar5->_M_allocated_capacity)[-2],
                          paVar5->_M_allocated_capacity + 1);
        }
        paVar5 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(&paVar5->_M_allocated_capacity + -5);
        lVar4 = lVar4 + 0x28;
      } while (lVar4 != 0);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>_>
                   ::~unordered_map,&astcQualityLevel(char_const*)::astc_quality_mapping_abi_cxx11_,
                   &__dso_handle);
      __cxa_guard_release(&astcQualityLevel(char_const*)::astc_quality_mapping_abi_cxx11_);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_e0,quality,(allocator<char> *)local_f4);
  iVar3 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&astcQualityLevel(char_const*)::astc_quality_mapping_abi_cxx11_._M_h,
                 &local_e0.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
    operator_delete(local_e0.first._M_dataplus._M_p,local_e0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (iVar3.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_true>
      ._M_cur == (__node_type *)0x0) {
    kVar1 = KTX_PACK_ASTC_QUALITY_LEVEL_MEDIUM;
  }
  else {
    kVar1 = *(ktx_pack_astc_quality_levels_e *)
             ((long)iVar3.
                    super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ktx_pack_astc_quality_levels_e>,_true>
                    ._M_cur + 0x28);
  }
  return kVar1;
}

Assistant:

ktx_pack_astc_quality_levels_e
astcQualityLevel(const char *quality) {

    static std::unordered_map<std::string,
                              ktx_pack_astc_quality_levels_e> astc_quality_mapping{
        {"fastest", KTX_PACK_ASTC_QUALITY_LEVEL_FASTEST},
        {"fast", KTX_PACK_ASTC_QUALITY_LEVEL_FAST},
        {"medium", KTX_PACK_ASTC_QUALITY_LEVEL_MEDIUM},
        {"thorough", KTX_PACK_ASTC_QUALITY_LEVEL_THOROUGH},
        {"exhaustive", KTX_PACK_ASTC_QUALITY_LEVEL_EXHAUSTIVE}
    };

  auto opt = astc_quality_mapping.find(quality);

  if (opt != astc_quality_mapping.end())
      return opt->second;

  return KTX_PACK_ASTC_QUALITY_LEVEL_MEDIUM;
}